

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__resample_row_hv_2(stbi_uc *out,stbi_uc *in_near,stbi_uc *in_far,int w,int hs)

{
  stbi_uc sVar1;
  int iVar2;
  int local_3c;
  int t1;
  int t0;
  int i;
  int hs_local;
  int w_local;
  stbi_uc *in_far_local;
  stbi_uc *in_near_local;
  stbi_uc *out_local;
  
  if (w == 1) {
    sVar1 = (stbi_uc)((int)((uint)*in_near * 3 + (uint)*in_far + 2) >> 2);
    out[1] = sVar1;
    *out = sVar1;
  }
  else {
    local_3c = (uint)*in_near * 3 + (uint)*in_far;
    *out = (stbi_uc)(local_3c + 2 >> 2);
    for (t1 = 1; t1 < w; t1 = t1 + 1) {
      iVar2 = (uint)in_near[t1] * 3 + (uint)in_far[t1];
      out[t1 * 2 + -1] = (stbi_uc)(local_3c * 3 + iVar2 + 8 >> 4);
      out[t1 << 1] = (stbi_uc)(iVar2 * 3 + local_3c + 8 >> 4);
      local_3c = iVar2;
    }
    out[w * 2 + -1] = (stbi_uc)(local_3c + 2 >> 2);
  }
  return out;
}

Assistant:

static stbi_uc* stbi__resample_row_hv_2(stbi_uc* out, stbi_uc* in_near, stbi_uc* in_far, int w, int hs)
{
    // need to generate 2x2 samples for every one in input
    int i, t0, t1;
    if (w == 1) {
        out[0] = out[1] = stbi__div4(3 * in_near[0] + in_far[0] + 2);
        return out;
    }

    t1 = 3 * in_near[0] + in_far[0];
    out[0] = stbi__div4(t1 + 2);
    for (i = 1; i < w; ++i) {
        t0 = t1;
        t1 = 3 * in_near[i] + in_far[i];
        out[i * 2 - 1] = stbi__div16(3 * t0 + t1 + 8);
        out[i * 2] = stbi__div16(3 * t1 + t0 + 8);
    }
    out[w * 2 - 1] = stbi__div4(t1 + 2);

    STBI_NOTUSED(hs);

    return out;
}